

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O1

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  int iVar6;
  MutexLock l;
  MutexLock local_38;
  
  iVar6 = fLI::FLAGS_v;
  sVar4 = strlen(module_pattern);
  local_38.mu_ = (Mutex *)vmodule_lock;
  if ((vmodule_lock[0x38] == '\x01') &&
     (iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)vmodule_lock), iVar3 != 0)) {
    abort();
  }
  if (vmodule_list == (long *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    plVar5 = vmodule_list;
    do {
      iVar3 = std::__cxx11::string::compare((char *)plVar5);
      if (iVar3 == 0) {
        if (!bVar2) {
          iVar6 = (int)plVar5[4];
          bVar2 = true;
        }
        *(int *)(plVar5 + 4) = log_level;
      }
      else if ((!bVar2) &&
              (bVar1 = glog_internal_namespace_::SafeFNMatch_
                                 ((char *)*plVar5,plVar5[1],module_pattern,(long)(int)sVar4), bVar1)
              ) {
        iVar6 = (int)plVar5[4];
        bVar2 = true;
      }
      plVar5 = (long *)plVar5[5];
    } while (plVar5 != (long *)0x0);
  }
  if (!bVar2) {
    plVar5 = (long *)operator_new(0x30);
    *plVar5 = (long)(plVar5 + 2);
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    strlen(module_pattern);
    std::__cxx11::string::_M_replace((ulong)plVar5,0,(char *)0x0,(ulong)module_pattern);
    *(int *)(plVar5 + 4) = log_level;
    plVar5[5] = (long)vmodule_list;
    vmodule_list = plVar5;
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
  if ((0 < *SetVLOGLevel::vlocal__) &&
     ((SetVLOGLevel::vlocal__ != &kLogSiteUninitialized ||
      (bVar2 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
                           ,1), bVar2)))) {
    RawLog__(0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
             ,0xc5,"Set VLOG level for \"%s\" to %d",module_pattern,log_level);
  }
  return iVar6;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  int const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    MutexLock l(&vmodule_lock);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list;
         info != NULL; info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found  &&
                 SafeFNMatch_(info->module_pattern.c_str(),
                              info->module_pattern.size(),
                              module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}